

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cc
# Opt level: O0

void __thiscall re2c::ScannerState::ScannerState(ScannerState *this,ScannerState *s)

{
  ScannerState *s_local;
  ScannerState *this_local;
  
  this->tok = s->tok;
  this->ptr = s->ptr;
  this->cur = s->cur;
  this->pos = s->pos;
  this->ctx = s->ctx;
  this->bot = s->bot;
  this->lim = s->lim;
  this->top = s->top;
  this->eof = s->eof;
  this->tchar = s->tchar;
  this->tline = s->tline;
  this->cline = s->cline;
  this->in_parse = (bool)(s->in_parse & 1);
  this->lexer_state = s->lexer_state;
  return;
}

Assistant:

ScannerState::ScannerState (const ScannerState & s)
	: tok (s.tok)
	, ptr (s.ptr)
	, cur (s.cur)
	, pos (s.pos)
	, ctx (s.ctx)
	, bot (s.bot)
	, lim (s.lim)
	, top (s.top)
	, eof (s.eof)
	, tchar (s.tchar)
	, tline (s.tline)
	, cline (s.cline)
	, in_parse (s.in_parse)
	, lexer_state (s.lexer_state)
{}